

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

void mpp_h264d_fill_dynamic_meta(H264dCurCtx_t *p_Cur,RK_U8 *data,RK_U32 size,RK_U32 hdr_fmt)

{
  MppFrameHdrDynamicMeta *pMStack_28;
  RK_U8 start_code [4];
  MppFrameHdrDynamicMeta *hdr_dynamic_meta;
  RK_U32 hdr_fmt_local;
  RK_U32 size_local;
  RK_U8 *data_local;
  H264dCurCtx_t *p_Cur_local;
  
  pMStack_28 = p_Cur->hdr_dynamic_meta;
  hdr_dynamic_meta._4_4_ = size;
  if (hdr_fmt == 0xb) {
    hdr_dynamic_meta._4_4_ = size + 4;
  }
  if ((pMStack_28 != (MppFrameHdrDynamicMeta *)0x0) && (pMStack_28->size < hdr_dynamic_meta._4_4_))
  {
    mpp_osal_free("mpp_h264d_fill_dynamic_meta",pMStack_28);
    pMStack_28 = (MppFrameHdrDynamicMeta *)0x0;
  }
  if ((pMStack_28 == (MppFrameHdrDynamicMeta *)0x0) &&
     (pMStack_28 = (MppFrameHdrDynamicMeta *)
                   mpp_osal_calloc("mpp_h264d_fill_dynamic_meta",(ulong)hdr_dynamic_meta._4_4_ + 8),
     pMStack_28 == (MppFrameHdrDynamicMeta *)0x0)) {
    _mpp_log_l(2,"h264d_parse","malloc hdr dynamic data failed!\n","mpp_h264d_fill_dynamic_meta");
  }
  else {
    if ((hdr_dynamic_meta._4_4_ != 0) && (data != (RK_U8 *)0x0)) {
      if (hdr_fmt == 0xb) {
        pMStack_28[1].hdr_fmt = 0x1000000;
        memcpy(&pMStack_28[1].size,data,(ulong)(hdr_dynamic_meta._4_4_ - 4));
      }
      else {
        memcpy(pMStack_28 + 1,data,(ulong)hdr_dynamic_meta._4_4_);
      }
      pMStack_28->size = hdr_dynamic_meta._4_4_;
      pMStack_28->hdr_fmt = hdr_fmt;
    }
    p_Cur->hdr_dynamic_meta = pMStack_28;
    p_Cur->hdr_dynamic = 1;
  }
  return;
}

Assistant:

void mpp_h264d_fill_dynamic_meta(H264dCurCtx_t *p_Cur, const RK_U8 *data, RK_U32 size, RK_U32 hdr_fmt)
{
    MppFrameHdrDynamicMeta *hdr_dynamic_meta = p_Cur->hdr_dynamic_meta;

    if (hdr_fmt == DOLBY)
        size += 4;

    if (hdr_dynamic_meta && (hdr_dynamic_meta->size < size)) {
        mpp_free(hdr_dynamic_meta);
        hdr_dynamic_meta = NULL;
    }

    if (!hdr_dynamic_meta) {
        hdr_dynamic_meta = mpp_calloc_size(MppFrameHdrDynamicMeta,
                                           sizeof(MppFrameHdrDynamicMeta) + size);
        if (!hdr_dynamic_meta) {
            mpp_err_f("malloc hdr dynamic data failed!\n");
            return;
        }
    }
    if (size && data) {
        if (hdr_fmt == DOLBY) {
            RK_U8 start_code[4] = {0, 0, 0, 1};

            memcpy((RK_U8*)hdr_dynamic_meta->data, start_code, 4);
            memcpy((RK_U8*)hdr_dynamic_meta->data + 4, (RK_U8*)data, size - 4);
        } else
            memcpy((RK_U8*)hdr_dynamic_meta->data, (RK_U8*)data, size);
        hdr_dynamic_meta->size = size;
        hdr_dynamic_meta->hdr_fmt = hdr_fmt;
    }
    p_Cur->hdr_dynamic_meta = hdr_dynamic_meta;
    p_Cur->hdr_dynamic = 1;
}